

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FoldingSet.cpp
# Opt level: O0

void __thiscall llvm::FoldingSetIteratorImpl::advance(FoldingSetIteratorImpl *this)

{
  void *NextInBucketPtr;
  Node *pNVar1;
  bool bVar2;
  void **local_28;
  void **Bucket;
  FoldingSetNode *NextNodeInBucket;
  void *Probe;
  FoldingSetIteratorImpl *this_local;
  
  NextInBucketPtr = FoldingSetBase::Node::getNextInBucket(this->NodePtr);
  pNVar1 = GetNextPtr(NextInBucketPtr);
  if (pNVar1 == (Node *)0x0) {
    local_28 = GetBucketPtr(NextInBucketPtr);
    do {
      local_28 = local_28 + 1;
      bVar2 = false;
      if ((*local_28 != (void *)0xffffffffffffffff) && (bVar2 = true, *local_28 != (void *)0x0)) {
        pNVar1 = GetNextPtr(*local_28);
        bVar2 = pNVar1 == (Node *)0x0;
      }
    } while (bVar2);
    this->NodePtr = (FoldingSetNode *)*local_28;
  }
  else {
    this->NodePtr = pNVar1;
  }
  return;
}

Assistant:

void FoldingSetIteratorImpl::advance() {
  // If there is another link within this bucket, go to it.
  void *Probe = NodePtr->getNextInBucket();

  if (FoldingSetNode *NextNodeInBucket = GetNextPtr(Probe))
    NodePtr = NextNodeInBucket;
  else {
    // Otherwise, this is the last link in this bucket.
    void **Bucket = GetBucketPtr(Probe);

    // Skip to the next non-null non-self-cycle bucket.
    do {
      ++Bucket;
    } while (*Bucket != reinterpret_cast<void*>(-1) &&
             (!*Bucket || !GetNextPtr(*Bucket)));

    NodePtr = static_cast<FoldingSetNode*>(*Bucket);
  }
}